

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildReg5
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *src1Opnd_00;
  RegOpnd *pRVar4;
  RegOpnd *pRVar5;
  RegOpnd *pRVar6;
  RegOpnd *dstOpnd_00;
  RegOpnd *dstOpnd_01;
  Instr *pIVar7;
  Opnd *pOVar8;
  HelperCallOpnd *src1Opnd_01;
  HelperCallOpnd *helperOpnd;
  RegOpnd *src4Opnd;
  RegOpnd *src3Opnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xa6d,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  src1Opnd_00 = BuildSrcOpnd(this,src1RegSlot,TyVar);
  pRVar4 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  pRVar5 = BuildSrcOpnd(this,src3RegSlot,TyVar);
  pRVar6 = BuildSrcOpnd(this,src4RegSlot,TyVar);
  dstOpnd_00 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  dstOpnd_01 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar7 = IR::Instr::New(ArgOut_A,&dstOpnd_01->super_Opnd,&pRVar6->super_Opnd,this->m_func);
  AddInstr(this,pIVar7,offset);
  pRVar6 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar8 = IR::Instr::GetDst(pIVar7);
  pIVar7 = IR::Instr::New(ArgOut_A,&pRVar6->super_Opnd,&pRVar5->super_Opnd,pOVar8,this->m_func);
  AddInstr(this,pIVar7,0xffffffff);
  pRVar5 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar8 = IR::Instr::GetDst(pIVar7);
  pIVar7 = IR::Instr::New(ArgOut_A,&pRVar5->super_Opnd,&pRVar4->super_Opnd,pOVar8,this->m_func);
  AddInstr(this,pIVar7,0xffffffff);
  pRVar4 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar8 = IR::Instr::GetDst(pIVar7);
  pIVar7 = IR::Instr::New(ArgOut_A,&pRVar4->super_Opnd,&src1Opnd_00->super_Opnd,pOVar8,this->m_func)
  ;
  AddInstr(this,pIVar7,0xffffffff);
  if (newOpcode == ApplyArgs) {
    src1Opnd_01 = IR::HelperCallOpnd::New(HelperOp_OP_ApplyArgs,this->m_func);
    pOVar8 = IR::Instr::GetDst(pIVar7);
    pIVar7 = IR::Instr::New(CallHelper,&dstOpnd_00->super_Opnd,&src1Opnd_01->super_Opnd,pOVar8,
                            this->m_func);
    AddInstr(this,pIVar7,0xffffffff);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0xa90,"((0))","Unknown Reg5 opcode");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void
IRBuilder::BuildReg5(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                            Js::RegSlot src2RegSlot, Js::RegSlot src3RegSlot, Js::RegSlot src4RegSlot)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IR::RegOpnd *   dstOpnd;
    IR::RegOpnd *   src1Opnd;
    IR::RegOpnd *   src2Opnd;
    IR::RegOpnd *   src3Opnd;
    IR::RegOpnd *   src4Opnd;
    // We can't support instructions with more than 2 srcs. Instead create a CallHelper instructions,
    // and pass the srcs as ArgOut_A instructions.
    src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    src3Opnd = this->BuildSrcOpnd(src3RegSlot);
    src4Opnd = this->BuildSrcOpnd(src4RegSlot);
    dstOpnd = this->BuildDstOpnd(dstRegSlot);
    
    instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src4Opnd, m_func);
    this->AddInstr(instr, offset);

    instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    IR::HelperCallOpnd *helperOpnd;

    switch (newOpcode) {
    case Js::OpCode::ApplyArgs:
        helperOpnd=IR::HelperCallOpnd::New(IR::HelperOp_OP_ApplyArgs, this->m_func);
        break;
    default:
        AssertMsg(UNREACHED, "Unknown Reg5 opcode");
        Fatal();
    }
    instr = IR::Instr::New(Js::OpCode::CallHelper, dstOpnd, helperOpnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
}